

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder
          (TPZCompElHCurl<pzshape::TPZShapeTetra> *this,int connect)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  stringstream sout;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  long local_190 [47];
  
  if (-1 < connect) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (connect < iVar2) {
      lVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,connect);
      return (int)*(byte *)(lVar3 + 0x14);
    }
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "virtual int TPZCompElHCurl<pzshape::TPZShapeTetra>::ConnectOrder(int) const [TSHAPE = pzshape::TPZShapeTetra]"
             ,0x6d);
  cVar1 = (char)(ostream *)local_190;
  std::ios::widen((char)*(undefined8 *)(local_190[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Connect index out of range connect ",0x23);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,connect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," nconnects ",0xb);
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))(this);
  std::ostream::operator<<(poVar4,iVar2);
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_1c0,local_1b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
             ,0x106);
}

Assistant:

int TPZCompElHCurl<TSHAPE>::ConnectOrder(int connect) const {
    if (connect < 0 || connect >= this->NConnects()) {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__<<std::endl;
        sout << "Connect index out of range connect " << connect << " nconnects " << NConnects();
        PZError<<sout.str()<<std::endl;
#ifdef PZ_LOG
        LOGPZ_ERROR(logger, sout.str())
#endif
        DebugStop();
        return -1;
    }
    TPZConnect &c = this-> Connect(connect);
    return c.Order();
}